

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_get_byte(AMQP_VALUE value,char *byte_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || byte_value == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x202;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_byte",0x201,1,"Bad arguments: value = %p, byte_value = %p",value,
                byte_value);
    }
  }
  else if (value->type == AMQP_TYPE_BYTE) {
    *byte_value = (value->value).ubyte_value;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x20b;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_byte",0x20a,1,"Value is not of type BYTE");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_byte(AMQP_VALUE value, char* byte_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_059: [If any of the arguments is NULL then amqpvalue_get_byte shall return a non-zero value.] */
    if ((value == NULL) ||
        (byte_value == NULL))
    {
        LogError("Bad arguments: value = %p, byte_value = %p",
            value, byte_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_060: [If the type of the value is not byte (was not created with amqpvalue_create_byte), then amqpvalue_get_byte shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_BYTE)
        {
            LogError("Value is not of type BYTE");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_057: [amqpvalue_get_byte shall fill in the byte_value argument the char value stored by the AMQP value indicated by the value argument.] */
            *byte_value = value_data->value.byte_value;

            /* Codes_SRS_AMQPVALUE_01_058: [On success amqpvalue_get_byte shall return 0.] */
            result = 0;
        }
    }

    return result;
}